

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

void __thiscall w3Interp::interp(w3Interp *this,w3Module *mod,w3Export *emain)

{
  uint uVar1;
  size_type sVar2;
  size_type sVar3;
  undefined1 local_a8 [8];
  w3ModuleInstance instance;
  w3Function *fmain;
  w3Export *emain_local;
  w3Module *mod_local;
  w3Interp *this_local;
  
  if (((mod == (w3Module *)0x0) || (emain == (w3Export *)0x0)) ||
     (emain->tag != w3ImportTag_Function)) {
    AssertFailed("mod && emain && emain->tag == w3ExportTag_Function");
  }
  uVar1 = (emain->field_4).function;
  sVar2 = std::vector<w3Function,_std::allocator<w3Function>_>::size(&mod->functions);
  if (sVar2 <= uVar1) {
    AssertFailed("emain->function < mod->functions.size ()");
  }
  uVar1 = (emain->field_4).function;
  sVar2 = std::vector<w3Code,_std::allocator<w3Code>_>::size(&mod->code);
  if (sVar2 <= uVar1) {
    AssertFailed("emain->function < mod->code.size ()");
  }
  sVar2 = std::vector<w3Function,_std::allocator<w3Function>_>::size(&mod->functions);
  sVar3 = std::vector<w3Code,_std::allocator<w3Code>_>::size(&mod->code);
  if (sVar2 != sVar3) {
    AssertFailed("mod->functions.size () == mod->code.size ()");
  }
  instance.exports.super__Vector_base<w3ExportInstance,_std::allocator<w3ExportInstance>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<w3Function,_std::allocator<w3Function>_>::operator[]
                          (&mod->functions,(ulong)(emain->field_4).function);
  this->module = mod;
  w3ModuleInstance::w3ModuleInstance((w3ModuleInstance *)local_a8,this->module);
  this->module_instance = (w3ModuleInstance *)local_a8;
  Invoke(this,(w3Function *)
              instance.exports.
              super__Vector_base<w3ExportInstance,_std::allocator<w3ExportInstance>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  w3ModuleInstance::~w3ModuleInstance((w3ModuleInstance *)local_a8);
  return;
}

Assistant:

void interp (w3Module* mod, w3Export* emain = 0)
    {
        Assert (mod && emain && emain->tag == w3ExportTag_Function);
        Assert (emain->function < mod->functions.size ());
        Assert (emain->function < mod->code.size ());
        Assert (mod->functions.size () == mod->code.size ());

        w3Function& fmain = mod->functions [emain->function];
        //w3Code& cmain = mod->code [emain->function];

        // instantiate module
        this->module = mod;
        w3ModuleInstance instance (module);
        this->module_instance = &instance;

        // Simulate call to initial function.
        Invoke (fmain);
    }